

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

void capnp::_::(anonymous_namespace)::
     expectPromiseThrows<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>>
               (Promise<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>_>
                *promise,WaitScope *waitScope)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  OwnPromiseNode node;
  char cVar3;
  __pid_t _Var4;
  void *pvVar5;
  TransformPromiseNodeBase *this;
  DebugExpression<bool> _kjCondition;
  DebugExpression<bool> local_49;
  OwnPromiseNode local_48;
  char *local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  pPVar1 = (promise->super_PromiseBase).node.ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x28) {
    pvVar5 = operator_new(0x400);
    this = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)promise,
               kj::_::
               TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3)>
               ::anon_class_1_0_00000001_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_006baa18;
    *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this = (TransformPromiseNodeBase *)&pPVar1[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this,(OwnPromiseNode *)promise,
               kj::_::
               TransformPromiseNode<capnp::Response<capnproto_test::capnp::test::TestCallOrder::GetCallSequenceResults>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:1359:3)>
               ::anon_class_1_0_00000001_for_func::operator());
    pPVar1[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006baa18;
    pPVar1[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar2;
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  pcStack_38 = "expectPromiseThrows";
  local_30 = 0x1700000550;
  local_48.ptr = &this->super_PromiseNode;
  _Var4 = kj::Promise<bool>::wait((Promise<bool> *)&local_48,waitScope);
  node.ptr = local_48.ptr;
  cVar3 = (char)_Var4;
  local_49.value = (bool)cVar3;
  if ((TransformPromiseNodeBase *)local_48.ptr != (TransformPromiseNodeBase *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  if (cVar3 == '\0' && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[112],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x550,ERROR,
               "\"failed: expected \" \"promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)\", _kjCondition"
               ,(char (*) [112])
                "failed: expected promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; }) .wait(waitScope)"
               ,&local_49);
  }
  return;
}

Assistant:

void expectPromiseThrows(kj::Promise<T>&& promise, kj::WaitScope& waitScope) {
  KJ_EXPECT(promise.then([](T&&) { return false; }, [](kj::Exception&&) { return true; })
      .wait(waitScope));
}